

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void btSoftBody::PSolve_SContacts(btSoftBody *psb,btScalar param_2,btScalar ti)

{
  long *plVar1;
  uint uVar2;
  SContact *pSVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  btVector3 *pbVar7;
  btVector3 *this;
  float fVar8;
  float fVar9;
  btScalar bVar10;
  float fVar11;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar13;
  float in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  btVector3 bVar14;
  btVector3 bVar15;
  btScalar j;
  btVector3 vr;
  float local_a8;
  float fStack_a4;
  float local_98;
  btVector3 local_88;
  undefined1 local_78 [16];
  btSoftBody *local_68;
  ulong local_60;
  btVector3 local_58;
  undefined1 local_48 [16];
  
  uVar2 = (psb->m_scontacts).m_size;
  uVar6 = 0;
  local_60 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    local_60 = uVar6;
  }
  local_60 = local_60 << 6;
  local_68 = psb;
  for (; local_60 != uVar6; uVar6 = uVar6 + 0x40) {
    pSVar3 = (local_68->m_scontacts).m_data;
    plVar1 = (long *)((long)&((SContact *)(&pSVar3->m_weights + -1))->m_node + uVar6);
    this = (btVector3 *)(plVar1 + 4);
    lVar4 = *plVar1;
    lVar5 = plVar1[1];
    pbVar7 = (btVector3 *)((long)(pSVar3->m_weights).m_floats + uVar6);
    bVar14 = BaryEval<btVector3>((btVector3 *)(*(long *)(lVar5 + 0x10) + 0x10),
                                 (btVector3 *)(*(long *)(lVar5 + 0x18) + 0x10),
                                 (btVector3 *)(*(long *)(lVar5 + 0x20) + 0x10),pbVar7);
    bVar15 = BaryEval<btVector3>((btVector3 *)(*(long *)(lVar5 + 0x10) + 0x20),
                                 (btVector3 *)(*(long *)(lVar5 + 0x18) + 0x20),
                                 (btVector3 *)(*(long *)(lVar5 + 0x20) + 0x20),pbVar7);
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_8_ = bVar15.m_floats._0_8_;
    local_78._12_4_ = extraout_XMM0_Dd;
    local_48._8_4_ = in_XMM1_Dc;
    local_48._0_8_ = bVar15.m_floats._8_8_;
    local_48._12_4_ = in_XMM1_Dd;
    pbVar7 = (btVector3 *)(lVar4 + 0x10);
    bVar15 = operator-(pbVar7,(btVector3 *)(lVar4 + 0x20));
    local_98 = bVar14.m_floats[2];
    local_a8 = bVar14.m_floats[0];
    fStack_a4 = bVar14.m_floats[1];
    fVar8 = bVar15.m_floats[0] - (local_a8 - (float)local_78._0_4_);
    fVar11 = bVar15.m_floats[1] - (fStack_a4 - (float)local_78._4_4_);
    fVar13 = bVar15.m_floats[2] - (local_98 - (float)local_48._0_4_);
    local_58.m_floats[1] = fVar11;
    local_58.m_floats[0] = fVar8;
    local_58.m_floats[2] = fVar13;
    local_58.m_floats[3] = 0.0;
    fVar9 = 0.0;
    fVar12 = 0.0;
    in_XMM1_Dc = 0.0;
    if (*(float *)((long)(pSVar3->m_normal).m_floats + uVar6 + 8) * fVar13 +
        fVar8 * *(float *)((long)(pSVar3->m_normal).m_floats + uVar6) +
        fVar11 * *(float *)((long)(pSVar3->m_normal).m_floats + uVar6 + 4) < 0.0) {
      local_78._0_4_ = *(undefined4 *)((long)pSVar3->m_cfm + (uVar6 - 8));
      bVar10 = btVector3::dot(this,pbVar7);
      local_88.m_floats[0] =
           (float)local_78._0_4_ -
           (bVar10 - (local_98 * *(float *)((long)(pSVar3->m_normal).m_floats + uVar6 + 8) +
                     *(float *)((long)(pSVar3->m_normal).m_floats + uVar6) * local_a8 +
                     fStack_a4 * *(float *)((long)(pSVar3->m_normal).m_floats + uVar6 + 4)));
      bVar14 = operator*(this,local_88.m_floats);
      fVar9 = bVar14.m_floats[0] + 0.0;
      fVar12 = bVar14.m_floats[1] + 0.0;
      in_XMM1_Dc = bVar14.m_floats[2] + 0.0;
    }
    bVar14 = ProjectOnAxis(&local_58,this);
    fVar8 = *(float *)((long)pSVar3->m_cfm + (uVar6 - 4));
    in_XMM1_Dc = in_XMM1_Dc - (local_58.m_floats[2] - bVar14.m_floats[2]) * fVar8;
    fVar11 = *(float *)((long)pSVar3->m_cfm + uVar6);
    fVar9 = fVar9 - fVar8 * (local_58.m_floats[0] - bVar14.m_floats[0]);
    fVar12 = fVar12 - fVar8 * (local_58.m_floats[1] - bVar14.m_floats[1]);
    local_88.m_floats[1] = fVar11 * fVar12;
    local_88.m_floats[0] = fVar11 * fVar9;
    local_88.m_floats[2] = fVar11 * in_XMM1_Dc;
    local_88.m_floats[3] = 0.0;
    btVector3::operator+=(pbVar7,&local_88);
    fVar8 = *(float *)((long)pSVar3->m_cfm + uVar6 + 4) *
            *(float *)((long)(pSVar3->m_weights).m_floats + uVar6);
    local_88.m_floats[1] = fVar8 * fVar12;
    local_88.m_floats[0] = fVar8 * fVar9;
    local_88.m_floats[2] = fVar8 * in_XMM1_Dc;
    local_88.m_floats[3] = 0.0;
    btVector3::operator-=((btVector3 *)(*(long *)(lVar5 + 0x10) + 0x10),&local_88);
    fVar8 = *(float *)((long)pSVar3->m_cfm + uVar6 + 4) *
            *(float *)((long)(pSVar3->m_weights).m_floats + uVar6 + 4);
    local_88.m_floats[1] = fVar8 * fVar12;
    local_88.m_floats[0] = fVar8 * fVar9;
    local_88.m_floats[2] = fVar8 * in_XMM1_Dc;
    local_88.m_floats[3] = 0.0;
    btVector3::operator-=((btVector3 *)(*(long *)(lVar5 + 0x18) + 0x10),&local_88);
    fVar8 = *(float *)((long)pSVar3->m_cfm + uVar6 + 4) *
            *(float *)((long)(pSVar3->m_weights).m_floats + uVar6 + 8);
    in_XMM1_Dc = fVar8 * in_XMM1_Dc;
    in_XMM1_Dd = 0;
    local_88.m_floats[1] = fVar8 * fVar12;
    local_88.m_floats[0] = fVar8 * fVar9;
    local_88.m_floats[2] = in_XMM1_Dc;
    local_88.m_floats[3] = 0.0;
    btVector3::operator-=((btVector3 *)(*(long *)(lVar5 + 0x20) + 0x10),&local_88);
  }
  return;
}

Assistant:

void				btSoftBody::PSolve_SContacts(btSoftBody* psb,btScalar,btScalar ti)
{
	for(int i=0,ni=psb->m_scontacts.size();i<ni;++i)
	{
		const SContact&		c=psb->m_scontacts[i];
		const btVector3&	nr=c.m_normal;
		Node&				n=*c.m_node;
		Face&				f=*c.m_face;
		const btVector3		p=BaryEval(	f.m_n[0]->m_x,
			f.m_n[1]->m_x,
			f.m_n[2]->m_x,
			c.m_weights);
		const btVector3		q=BaryEval(	f.m_n[0]->m_q,
			f.m_n[1]->m_q,
			f.m_n[2]->m_q,
			c.m_weights);											
		const btVector3		vr=(n.m_x-n.m_q)-(p-q);
		btVector3			corr(0,0,0);
		btScalar dot = btDot(vr,nr);
		if(dot<0)
		{
			const btScalar	j=c.m_margin-(btDot(nr,n.m_x)-btDot(nr,p));
			corr+=c.m_normal*j;
		}
		corr			-=	ProjectOnPlane(vr,nr)*c.m_friction;
		n.m_x			+=	corr*c.m_cfm[0];
		f.m_n[0]->m_x	-=	corr*(c.m_cfm[1]*c.m_weights.x());
		f.m_n[1]->m_x	-=	corr*(c.m_cfm[1]*c.m_weights.y());
		f.m_n[2]->m_x	-=	corr*(c.m_cfm[1]*c.m_weights.z());
	}
}